

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  byte *pbVar4;
  uint local_90;
  uint local_8c;
  int n_1;
  int n;
  int64_t body;
  int64_t l;
  ssize_t nl;
  ssize_t llen;
  ssize_t len;
  ssize_t total;
  ssize_t used;
  ssize_t ravail;
  ssize_t avail_in;
  uchar *out;
  uchar *d;
  uchar *b;
  uudecode *uudecode;
  void **buff_local;
  archive_read_filter *self_local;
  
  b = (uchar *)self->data;
  uudecode = (uudecode *)buff;
  buff_local = (void **)self;
  do {
    out = (uchar *)__archive_read_filter_ahead((archive_read_filter *)buff_local[2],1,&ravail);
    if ((out == (uchar *)0x0) && (ravail < 0)) {
      return -0x1e;
    }
    if (out == (uchar *)0x0) {
      ravail = 0;
    }
    total = 0;
    len = 0;
    avail_in = *(ssize_t *)(b + 0x20);
    used = ravail;
    if (*(int *)(b + 0x28) == 4) {
      total = ravail;
      goto LAB_007d3399;
    }
    if (*(int *)(b + 0x10) != 0) {
      iVar2 = ensure_in_buff_size((archive_read_filter *)buff_local,(uudecode *)b,
                                  ravail + *(int *)(b + 0x10));
      if (iVar2 != 0) {
        return -0x1e;
      }
      memcpy((void *)(*(long *)(b + 8) + (long)*(int *)(b + 0x10)),out,ravail);
      out = *(uchar **)(b + 8);
      ravail = *(int *)(b + 0x10) + ravail;
      b[0x10] = '\0';
      b[0x11] = '\0';
      b[0x12] = '\0';
      b[0x13] = '\0';
    }
    while( true ) {
      if (ravail <= total) goto LAB_007d3399;
      d = out;
      llen = get_line(out,ravail - total,&l);
      if (llen < 0) {
        if ((*(int *)(b + 0x28) != 0) || ((*(long *)b < 1 && (len < 1)))) {
          archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
          return -0x1e;
        }
        b[0x28] = '\x04';
        b[0x29] = '\0';
        b[0x2a] = '\0';
        b[0x2b] = '\0';
        total = ravail;
        goto LAB_007d3399;
      }
      nl = llen;
      if ((l == 0) && (*(int *)(b + 0x28) != 2)) break;
      switch(*(undefined4 *)(b + 0x28)) {
      default:
        if (0x1ffff < len + llen) {
          archive_set_error((archive *)buff_local[3],0x54,"Invalid format data");
          return -0x1e;
        }
        if ((llen - l < 0xb) || (iVar2 = memcmp(d,"begin ",6), iVar2 != 0)) {
          if ((llen - l < 0x12) || (iVar2 = memcmp(d,"begin-base64 ",0xd), iVar2 != 0)) {
            body = 0;
          }
          else {
            body = 0xd;
          }
        }
        else {
          body = 6;
        }
        if ((((body != 0) && (0x2f < d[body])) && (d[body] < 0x38)) &&
           (((0x2f < d[body + 1] && (d[body + 1] < 0x38)) &&
            ((0x2f < d[body + 2] && ((d[body + 2] < 0x38 && (d[body + 3] == ' ')))))))) {
          if (body == 6) {
            b[0x28] = '\x01';
            b[0x29] = '\0';
            b[0x2a] = '\0';
            b[0x2b] = '\0';
          }
          else {
            b[0x28] = '\x03';
            b[0x29] = '\0';
            b[0x2a] = '\0';
            b[0x2b] = '\0';
          }
        }
        break;
      case 1:
        if (0x10000 < len + llen * 2) goto LAB_007d3399;
        if ((""[*d] == '\0') || (llen - l < 1)) {
          archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
          return -0x1e;
        }
        puVar3 = d + 1;
        body = (int64_t)(int)(*d - 0x20 & 0x3f);
        d = puVar3;
        if ((llen - l) + -1 < body) {
          archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
          return -0x1e;
        }
        if (body == 0) {
          b[0x28] = '\x02';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
        }
        else {
          while (0 < body) {
            local_8c = 0;
            if (0 < body) {
              if ((""[*d] == '\0') || (""[d[1]] == '\0')) break;
              pbVar4 = d + 1;
              bVar1 = *d;
              d = d + 2;
              local_8c = (*pbVar4 - 0x20 & 0x3f) << 0xc | (bVar1 - 0x20 & 0x3f) << 0x12;
              *(char *)avail_in = (char)(local_8c >> 0x10);
              len = len + 1;
              body = body + -1;
              avail_in = avail_in + 1;
            }
            if (0 < body) {
              if (""[*d] == '\0') break;
              local_8c = (*d - 0x20 & 0x3f) << 6 | local_8c;
              *(char *)avail_in = (char)(local_8c >> 8);
              len = len + 1;
              body = body + -1;
              avail_in = avail_in + 1;
              d = d + 1;
            }
            if (0 < body) {
              if (""[*d] == '\0') break;
              *(byte *)avail_in = *d - 0x20 & 0x3f | (byte)local_8c;
              len = len + 1;
              body = body + -1;
              avail_in = avail_in + 1;
              d = d + 1;
            }
          }
          if (body != 0) {
            archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
            return -0x1e;
          }
        }
        break;
      case 2:
        if ((llen - l != 3) || (iVar2 = memcmp(d,"end ",3), iVar2 != 0)) {
          archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
          return -0x1e;
        }
        b[0x28] = '\0';
        b[0x29] = '\0';
        b[0x2a] = '\0';
        b[0x2b] = '\0';
        break;
      case 3:
        if (0x10000 < len + llen * 2) goto LAB_007d3399;
        body = llen - l;
        if ((((body < 3) || (*d != '=')) || (d[1] != '=')) || (d[2] != '=')) {
          while (0 < body) {
            local_90 = 0;
            if (0 < body) {
              if ((""[*d] == '\0') || (""[d[1]] == '\0')) break;
              pbVar4 = d + 1;
              bVar1 = *d;
              d = d + 2;
              local_90 = base64num[*pbVar4] << 0xc | base64num[bVar1] << 0x12;
              *(char *)avail_in = (char)(local_90 >> 0x10);
              len = len + 1;
              body = body + -2;
              avail_in = avail_in + 1;
            }
            if (0 < body) {
              if ((*d == '=') || (""[*d] == '\0')) break;
              local_90 = base64num[*d] << 6 | local_90;
              *(char *)avail_in = (char)(local_90 >> 8);
              len = len + 1;
              body = body + -1;
              avail_in = avail_in + 1;
              d = d + 1;
            }
            if (0 < body) {
              if ((*d == '=') || (""[*d] == '\0')) break;
              *(byte *)avail_in = (byte)base64num[*d] | (byte)local_90;
              len = len + 1;
              body = body + -1;
              avail_in = avail_in + 1;
              d = d + 1;
            }
          }
          if ((body != 0) && (*d != '=')) {
            archive_set_error((archive *)buff_local[3],-1,"Insufficient compressed data");
            return -0x1e;
          }
        }
        else {
          b[0x28] = '\0';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
        }
      }
      out = out + nl;
      total = nl + total;
    }
    iVar2 = ensure_in_buff_size((archive_read_filter *)buff_local,(uudecode *)b,llen);
    if (iVar2 != 0) {
      return -0x1e;
    }
    if (*(uchar **)(b + 8) != d) {
      memmove(*(void **)(b + 8),d,llen);
    }
    *(int *)(b + 0x10) = (int)llen;
    if (len != 0) {
      total = llen + total;
LAB_007d3399:
      if (used < ravail) {
        total = total - (ravail - used);
      }
      __archive_read_filter_consume((archive_read_filter *)buff_local[2],total);
      uudecode->total = *(int64_t *)(b + 0x20);
      *(ssize_t *)b = len + *(long *)b;
      return len;
    }
    __archive_read_filter_consume((archive_read_filter *)buff_local[2],used);
  } while( true );
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of curent line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!uuchar[b[0]] || !uuchar[b[1]])
						break;
					n = UUDECODE(*b++) << 18;
					n |= UUDECODE(*b++) << 12;
					*out++ = n >> 16; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!base64[b[0]] || !base64[b[1]])
						break;
					n = base64num[*b++] << 18;
					n |= base64num[*b++] << 12;
					*out++ = n >> 16; total++;
					l -= 2;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}